

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O2

uint16_t __thiscall
level_tools::find_or_register_mu_model(level_tools *this,xr_ogf_v4 *new_mu,fmatrix *xform)

{
  uint *puVar1;
  float fVar2;
  ogf_model_type oVar3;
  pointer puVar4;
  pointer ppxVar5;
  value_type pxVar6;
  value_type pxVar7;
  ushort uVar8;
  int iVar9;
  const_reference ppxVar10;
  const_iterator it2;
  uint *puVar11;
  long lVar12;
  pointer ppxVar13;
  xr_bone_vec *a;
  const_iterator it1;
  uint *puVar14;
  xr_ogf_v4 *local_38;
  
  puVar4 = (new_mu->super_xr_ogf).m_children_l.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar14 = (new_mu->super_xr_ogf).m_children_l.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar12 = 0;
  while( true ) {
    puVar1 = (uint *)((long)puVar4 + lVar12);
    if (puVar1 == puVar14) {
      ppxVar5 = (this->m_mu_models).
                super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar8 = 0;
      for (ppxVar13 = (this->m_mu_models).
                      super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppxVar13 != ppxVar5;
          ppxVar13 = ppxVar13 + 1) {
        puVar14 = ((*ppxVar13)->m_children_l).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar1 = ((*ppxVar13)->m_children_l).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar11 = (new_mu->super_xr_ogf).m_children_l.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)puVar1 - (long)puVar14 ==
            (long)(new_mu->super_xr_ogf).m_children_l.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar11) {
          while( true ) {
            if (puVar14 == puVar1) {
              return uVar8;
            }
            ppxVar10 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                                 (this->m_subdivisions,(ulong)*puVar14);
            pxVar6 = *ppxVar10;
            ppxVar10 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                                 (this->m_subdivisions,(ulong)*puVar11);
            pxVar7 = *ppxVar10;
            if ((((pxVar6->m_model_type != pxVar7->m_model_type) ||
                 (*(int *)&pxVar6[1].super_xr_object.m_modif_name.field_2 !=
                  *(int *)&pxVar7[1].super_xr_object.m_modif_name.field_2)) ||
                (*(int *)((long)&pxVar6[1].super_xr_object.m_modif_name.field_2 + 4) !=
                 *(int *)((long)&pxVar7[1].super_xr_object.m_modif_name.field_2 + 4))) ||
               (((*(int *)((long)&pxVar6[1].super_xr_object.m_modif_name.field_2 + 8) !=
                  *(int *)((long)&pxVar7[1].super_xr_object.m_modif_name.field_2 + 8) ||
                 (*(int *)((long)&pxVar6[1].super_xr_object.m_modif_name.field_2 + 0xc) !=
                  *(int *)((long)&pxVar7[1].super_xr_object.m_modif_name.field_2 + 0xc))) ||
                ((pxVar6[1].super_xr_object.m_modified_time !=
                  pxVar7[1].super_xr_object.m_modified_time ||
                 (*(int *)&pxVar6[1].super_xr_object.field_0x14c !=
                  *(int *)&pxVar7[1].super_xr_object.field_0x14c)))))) break;
            puVar14 = puVar14 + 1;
            puVar11 = puVar11 + 1;
          }
        }
        uVar8 = uVar8 + 1;
      }
      if ((long)(this->m_mu_models).
                super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_mu_models).
                super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 == (ulong)uVar8) {
        local_38 = new_mu;
        std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>::
        emplace_back<xray_re::xr_ogf*>
                  ((vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>> *)&this->m_mu_models,
                   (xr_ogf **)&local_38);
        return uVar8;
      }
      __assert_fail("model_idx == m_mu_models.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x143,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    ppxVar10 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                         (this->m_subdivisions,(ulong)*puVar1);
    oVar3 = (*ppxVar10)->m_model_type;
    if ((oVar3 != MT3_LOD) && (oVar3 != MT3_SKELETON_GEOMDEF_ST)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11e,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    a = &(*ppxVar10)[1].super_xr_object.m_bones;
    xray_re::_matrix<float>::set<float>(xform,(_matrix<float> *)a);
    if ((lVar12 != 0) && (iVar9 = bcmp(a,xform,0x40), iVar9 != 0)) {
      __assert_fail("it == it0 || std::memcmp(&ogf->xform(), &xform, sizeof(xform)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                    ,0x11a,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)"
                   );
    }
    fVar2 = (xform->field_0).field_0._14;
    if ((((fVar2 != 0.0) || (NAN(fVar2))) || (fVar2 = (xform->field_0).field_0._24, fVar2 != 0.0))
       || (NAN(fVar2))) break;
    lVar12 = lVar12 + 4;
    fVar2 = (xform->field_0).field_0._34;
    if ((fVar2 != 0.0) || (NAN(fVar2))) break;
  }
  __assert_fail("xform._14 == 0 && xform._24 == 0 && xform._34 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                ,0x11b,"uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4 *, fmatrix &)");
}

Assistant:

uint16_t level_tools::find_or_register_mu_model(xr_ogf_v4* new_mu, fmatrix& xform)
{
	for (std::vector<uint32_t>::const_iterator it0 = new_mu->children_l().begin(),
			it = it0, end = new_mu->children_l().end(); it != end; ++it) {
		const xr_ogf_v4* ogf = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it));
		switch (ogf->model_type()) {
		case MT4_TREE_ST:
		case MT4_TREE_PM:
			xform.set(ogf->xform());
			xr_assert(it == it0 || std::memcmp(&ogf->xform(), &xform, sizeof(xform)) == 0);
			xr_assert(xform._14 == 0 && xform._24 == 0 && xform._34 == 0);
			break;
		default:
			xr_not_expected();
			break;
		}
	}

	uint16_t model_idx = 0;
	for (xr_ogf_vec_cit it = m_mu_models.begin(), end = m_mu_models.end();
			it != end; ++it, ++model_idx) {
		const xr_ogf* mu = *it;
		if (mu->children_l().size() != new_mu->children_l().size())
			continue;
		// FIXME: sort children for robustness
		for (std::vector<uint32_t>::const_iterator it1 = mu->children_l().begin(),
				end1 = mu->children_l().end(), it2 = new_mu->children_l().begin();
				it1 != end1; ++it1, ++it2) {
			const xr_ogf_v4* ogf1 = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it1));
			const xr_ogf_v4* ogf2 = static_cast<const xr_ogf_v4*>(m_subdivisions->at(*it2));
			if (ogf1->model_type() != ogf2->model_type())
				goto skip;
			// FIXME: though it is reasonably to assume MU-models always reference
			// external VB/IB, better have some explicit check here.
			if (ogf1->ext_vb_index() != ogf2->ext_vb_index())
				goto skip;
			if (ogf1->ext_vb_offset() != ogf2->ext_vb_offset())
				goto skip;
			if (ogf1->ext_vb_size() != ogf2->ext_vb_size())
				goto skip;
			if (ogf1->ext_ib_index() != ogf2->ext_ib_index())
				goto skip;
			if (ogf1->ext_ib_offset() != ogf2->ext_ib_offset())
				goto skip;
			if (ogf1->ext_ib_size() != ogf2->ext_ib_size())
				goto skip;
		}
		return model_idx;
skip:;
	}
	xr_assert(model_idx == m_mu_models.size());
	m_mu_models.push_back(new_mu);
	return model_idx;
}